

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QPointF __thiscall QGraphicsView::mapToScene(QGraphicsView *this,QPoint *point)

{
  int iVar1;
  int iVar2;
  QGraphicsViewPrivate *this_00;
  long lVar3;
  uint uVar4;
  long in_FS_OFFSET;
  double dVar5;
  double dVar6;
  QPointF QVar7;
  QPointF local_68 [5];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  iVar1 = (point->xp).m_i;
  iVar2 = (point->yp).m_i;
  uVar4 = *(uint *)&this_00->field_0x300;
  if ((uVar4 & 0x20) == 0) {
    lVar3 = this_00->scrollX;
  }
  else {
    QGraphicsViewPrivate::updateScroll(this_00);
    lVar3 = this_00->scrollX;
    uVar4 = *(uint *)&this_00->field_0x300;
    if ((uVar4 & 0x20) != 0) {
      QGraphicsViewPrivate::updateScroll(this_00);
      uVar4 = *(uint *)&this_00->field_0x300;
    }
  }
  dVar5 = (double)iVar1 + (double)lVar3;
  dVar6 = (double)iVar2 + (double)this_00->scrollY;
  if ((uVar4 & 0x10) == 0) {
    QTransform::inverted((bool *)local_68);
    dVar5 = (double)QTransform::map(local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  QVar7.yp = dVar6;
  QVar7.xp = dVar5;
  return QVar7;
}

Assistant:

QPointF QGraphicsView::mapToScene(const QPoint &point) const
{
    Q_D(const QGraphicsView);
    QPointF p = point;
    p.rx() += d->horizontalScroll();
    p.ry() += d->verticalScroll();
    return d->identityMatrix ? p : d->matrix.inverted().map(p);
}